

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall ddd::DaTrie<true,_true,_false>::shrink(DaTrie<true,_true,_false> *this)

{
  if ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>,_true>::_S_do_it
              (&this->bc_);
  }
  if ((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage !=
      (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::__shrink_to_fit_aux<std::vector<char,_std::allocator<char>_>,_true>::_S_do_it(&this->tail_)
    ;
  }
  if ((this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>,_true>::
    _S_do_it(&this->blocks_);
  }
  if ((this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>,_true>::
    _S_do_it(&this->node_links_);
    return;
  }
  return;
}

Assistant:

void shrink() {
    bc_.shrink_to_fit();
    tail_.shrink_to_fit();
    blocks_.shrink_to_fit();
    if (WithNLM) {
      node_links_.shrink_to_fit();
    }
  }